

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall slang::parsing::Lexer::scanIdentifier(Lexer *this)

{
  char c;
  bool bVar1;
  
  do {
    while( true ) {
      c = *this->sourceBuffer;
      bVar1 = isAlphaNumeric(c);
      if (!bVar1) break;
      this->sourceBuffer = this->sourceBuffer + 1;
    }
  } while (((c == '_') || (c == '$')) &&
          ((this->sourceBuffer = this->sourceBuffer + 1, c == '$' || (c == '_'))));
  return;
}

Assistant:

void Lexer::scanIdentifier() {
    while (true) {
        char c = peek();
        if (isAlphaNumeric(c) || c == '_' || c == '$')
            advance();
        else
            return;
    }
}